

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_buf.h
# Opt level: O0

void * __thiscall bsplib::AlignedBuf::append(AlignedBuf *this,size_t extra_bytes)

{
  size_t sVar1;
  unsigned_long *puVar2;
  void *x;
  void *__dest;
  void *result;
  void *aligned_ptr;
  void *ptr;
  unsigned_long local_28;
  unsigned_long local_20;
  size_t newsize;
  size_t extra_bytes_local;
  AlignedBuf *this_local;
  
  newsize = extra_bytes;
  extra_bytes_local = (size_t)this;
  newsize = align(this,extra_bytes);
  if (this->m_capacity < this->m_size + newsize) {
    local_28 = this->m_capacity << 1;
    ptr = (void *)(this->m_size + newsize);
    puVar2 = std::max<unsigned_long>(&local_28,(unsigned_long *)&ptr);
    local_20 = *puVar2;
    x = malloc(local_20 + this->m_alignment * 2);
    __dest = align(this,x);
    memcpy(__dest,this->m_aligned_ptr,this->m_size);
    free(this->m_ptr);
    this->m_ptr = x;
    this->m_aligned_ptr = __dest;
    this->m_capacity = local_20;
  }
  sVar1 = this->m_size;
  this->m_size = newsize + this->m_size;
  return (void *)((long)this->m_aligned_ptr + sVar1);
}

Assistant:

void * append( size_t extra_bytes ) {
        extra_bytes = align( extra_bytes );
        if ( m_size + extra_bytes > m_capacity ) {
            size_t newsize = std::max( 2 * m_capacity, m_size + extra_bytes );
            void * ptr = std::malloc( newsize + 2*m_alignment );
            void * aligned_ptr = align( ptr );
            std::memcpy( aligned_ptr, m_aligned_ptr, m_size );

            std::free( m_ptr );
            m_ptr = ptr;
            m_aligned_ptr = aligned_ptr; 
            m_capacity = newsize;
        }

        void * result = static_cast<char*>( m_aligned_ptr ) + m_size;
        m_size += extra_bytes;
        return result;
    }